

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O3

ListEntry __thiscall
SortedList<MessageQueue::ListEntry>::Pop(SortedList<MessageQueue::ListEntry> *this)

{
  uint uVar1;
  DListNode<MessageQueue::ListEntry> *pDVar2;
  MessageBase *pMVar3;
  DListNode<MessageQueue::ListEntry> *pDVar4;
  SortedList<MessageQueue::ListEntry> SVar5;
  DListNode<MessageQueue::ListEntry> **ppDVar6;
  ListEntry LVar7;
  
  pDVar2 = this->head;
  uVar1 = (pDVar2->data).time;
  pMVar3 = (pDVar2->data).message;
  pDVar4 = pDVar2->prev;
  SVar5.head = pDVar2->next;
  ppDVar6 = &pDVar4->next;
  if (pDVar4 == (DListNode<MessageQueue::ListEntry> *)0x0) {
    ppDVar6 = &this->head;
  }
  *ppDVar6 = SVar5.head;
  if (SVar5.head != (DListNode<MessageQueue::ListEntry> *)0x0) {
    (SVar5.head)->prev = pDVar4;
  }
  operator_delete(pDVar2);
  LVar7._4_4_ = 0;
  LVar7.time = uVar1;
  LVar7.message = pMVar3;
  return LVar7;
}

Assistant:

T Pop()
    {
        T data = head->data;
        Remove(head);
        return data;
    }